

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void Dither8x8(VP8Random *rg,uint8_t *dst,int bps,int amp)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  VP8Random *in_RDI;
  int i;
  uint8_t dither [64];
  int local_5c;
  uint8_t local_58 [64];
  int local_18;
  int local_14;
  uint8_t *local_10;
  VP8Random *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 1) {
    iVar1 = VP8RandomBits2(local_8,8,local_18);
    local_58[local_5c] = (uint8_t)iVar1;
  }
  (*VP8DitherCombine8x8)(local_58,local_10,local_14);
  return;
}

Assistant:

static void Dither8x8(VP8Random* const rg, uint8_t* dst, int bps, int amp) {
  uint8_t dither[64];
  int i;
  for (i = 0; i < 8 * 8; ++i) {
    dither[i] = VP8RandomBits2(rg, VP8_DITHER_AMP_BITS + 1, amp);
  }
  VP8DitherCombine8x8(dither, dst, bps);
}